

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string *name,Message *proto,FileDescriptor *file)

{
  Tables *this_00;
  Message *proto_00;
  bool bVar1;
  long lVar2;
  string *name_00;
  FileDescriptor *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Symbol SVar4;
  string sStack_c8;
  Message *local_a8;
  Symbol existing_symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &sStack_c8;
  SVar4.field_1.package_file_descriptor = file;
  SVar4._0_8_ = 8;
  bVar1 = DescriptorPool::Tables::AddSymbol(this->tables_,name,SVar4);
  if (bVar1) {
    lVar2 = std::__cxx11::string::rfind((char)name,0x2e);
    if (lVar2 == -1) {
      ValidateSymbolName(this,name,name,proto);
      return;
    }
    this_00 = this->tables_;
    local_a8 = proto;
    std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)name);
    name_00 = DescriptorPool::Tables::AllocateString(this_00,&sStack_c8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    proto_00 = local_a8;
    AddPackage(this,name_00,local_a8,file);
    std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)name);
    ValidateSymbolName(this,&sStack_c8,name,proto_00);
  }
  else {
    SVar4 = DescriptorPool::Tables::FindSymbol(this->tables_,name);
    existing_symbol.field_1 = SVar4.field_1;
    existing_symbol.type = SVar4.type;
    if (existing_symbol.type == PACKAGE) {
      return;
    }
    std::operator+(&local_50,"\"",name);
    std::operator+(&local_90,&local_50,
                   "\" is already defined (as something other than a package) in file \"");
    pFVar3 = Symbol::GetFile(&existing_symbol);
    std::operator+(&local_70,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar3);
    std::operator+(&sStack_c8,&local_70,"\".");
    AddError(this,name,proto,NAME,&sStack_c8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    this_01 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(
    const string& name, const Message& proto, const FileDescriptor* file) {
  if (tables_->AddSymbol(name, Symbol(file))) {
    // Success.  Also add parent package, if any.
    string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      string* parent_name = tables_->AllocateString(name.substr(0, dot_pos));
      AddPackage(*parent_name, proto, file);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else {
    Symbol existing_symbol = tables_->FindSymbol(name);
    // It's OK to redefine a package.
    if (existing_symbol.type != Symbol::PACKAGE) {
      // Symbol seems to have been defined in a different file.
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + name + "\" is already defined (as something other than "
               "a package) in file \"" + existing_symbol.GetFile()->name() +
               "\".");
    }
  }
}